

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O3

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadPackedData
          (ChimpGroupState<unsigned_int> *this,uint16_t *packed_data,idx_t packed_data_block_count)

{
  ushort uVar1;
  uint8_t *puVar2;
  idx_t iVar3;
  byte bVar4;
  
  if (packed_data_block_count != 0) {
    puVar2 = &this->unpacked_data_blocks[0].index;
    iVar3 = 0;
    do {
      uVar1 = packed_data[iVar3];
      *puVar2 = (byte)(uVar1 >> 9);
      bVar4 = (byte)uVar1 & 0x1f;
      if ((uVar1 & 0x1f) == 0) {
        bVar4 = 0x40;
      }
      puVar2[-1] = bVar4;
      ((UnpackedData *)(puVar2 + -2))->leading_zero =
           *(uint8_t *)
            ((long)&ChimpConstants::Decompression::LEADING_REPRESENTATION + (ulong)(uVar1 >> 6 & 7))
      ;
      iVar3 = iVar3 + 1;
      puVar2 = puVar2 + 3;
    } while (packed_data_block_count != iVar3);
  }
  this->unpacked_index = 0;
  this->max_packed_data_to_read = packed_data_block_count;
  return;
}

Assistant:

void LoadPackedData(uint16_t *packed_data, idx_t packed_data_block_count) {
		for (idx_t i = 0; i < packed_data_block_count; i++) {
			PackedDataUtils<CHIMP_TYPE>::Unpack(packed_data[i], unpacked_data_blocks[i]);
			if (unpacked_data_blocks[i].significant_bits == 0) {
				unpacked_data_blocks[i].significant_bits = 64;
			}
			unpacked_data_blocks[i].leading_zero =
			    ChimpConstants::Decompression::LEADING_REPRESENTATION[unpacked_data_blocks[i].leading_zero];
		}
		unpacked_index = 0;
		max_packed_data_to_read = packed_data_block_count;
	}